

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall
imrt::ACO::ACO(ACO *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  ACO *pAVar1;
  void *pvVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  ACO *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  int in_stack_0000003c;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  ACO *in_stack_00000060;
  int in_stack_00000070;
  int in_stack_00000078;
  int i;
  double initial_best;
  Ant *aux;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe64;
  Ant *in_stack_fffffffffffffe78;
  Ant *in_stack_fffffffffffffe80;
  Ant *in_stack_fffffffffffffe88;
  ACO *in_stack_fffffffffffffe90;
  ACO *this_00;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_ffffffffffffff18;
  Collimator *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int iVar5;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  Ant *local_60;
  
  *in_RDI = &PTR__ACO_001a2ba8;
  *(undefined4 *)(in_RDI + 3) = in_stack_00000028;
  in_RDI[4] = in_XMM0_Qa;
  this_00 = (ACO *)(in_RDI + 5);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::vector((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
            *)0x13e27d);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::vector((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
            *)0x13e293);
  std::
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  ::vector((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
            *)0x13e2a9);
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::vector
            ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)0x13e2c2);
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::vector
            ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)0x13e2de);
  std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::vector
            ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)0x13e2fa);
  in_RDI[0x17] = in_XMM1_Qa;
  in_RDI[0x18] = in_XMM2_Qa;
  in_RDI[0x19] = in_XMM3_Qa;
  std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::vector
            ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)0x13e349);
  in_RDI[0x1f] = in_R8;
  *(undefined4 *)(in_RDI + 0x20) = in_stack_00000008;
  in_RDI[0x21] = 0x4059000000000000;
  local_60 = (Ant *)0x7fefffffffffffff;
  initializePheromone(in_RSI);
  std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
  std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
  std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
  initializeHeuristic(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                      in_stack_00000040,in_stack_0000003c,in_stack_00000070,in_stack_00000078);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 3); iVar5 = iVar5 + 1) {
    pAVar1 = (ACO *)operator_new(0x50);
    std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
    std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
    std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RCX);
    uVar3 = in_stack_00000018;
    uVar4 = in_stack_00000020;
    Ant::Ant((Ant *)CONCAT44(iVar5,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    in_stack_fffffffffffffe90 = pAVar1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffe64,uVar4))
    ;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffe64,uVar4))
    ;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffe64,uVar4))
    ;
    std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::push_back
              ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)
               CONCAT44(in_stack_fffffffffffffe64,uVar4),
               (value_type *)CONCAT44(in_stack_fffffffffffffe5c,uVar3));
    in_stack_fffffffffffffe80 = local_60;
    in_stack_fffffffffffffe88 = (Ant *)Ant::getEvaluation((Ant *)0x13e59b);
    if ((double)in_stack_fffffffffffffe88 < (double)in_stack_fffffffffffffe80) {
      in_stack_fffffffffffffe78 = (Ant *)Ant::getEvaluation((Ant *)0x13e5c6);
      in_RDI[0x1d] = pAVar1;
      local_60 = in_stack_fffffffffffffe78;
    }
  }
  evaporation(this_00);
  globalDeposit(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pvVar2 = operator_new(0x50);
  Ant::Ant(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  in_RDI[0x1e] = pvVar2;
  return;
}

Assistant:

ACO (vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
       vector<Volume>& volumes, int _max_apertures, int max_intensity, int initial_intensity,
       int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, 
       double _rho): collimator(_collimator), max_apertures(_max_apertures), n_ants(_n_ants), 
        initial_pheromone(_initial_pheromone), alpha(_alpha), beta(_beta), rho(_rho) {
  
    Ant * aux;
    double initial_best = DBL_MAX;
    
    initializePheromone();
    initializeHeuristic(w,Zmin, Zmax, volumes, max_intensity, initial_intensity, step_intensity);
    
    for (int i=0; i < n_ants; i++) {
      aux = new Ant(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity);
      ants.push_back(aux);
      if (initial_best > aux->getEvaluation()) {
        initial_best = aux->getEvaluation();
        iteration_best = aux;
      }
    }
    evaporation();
    globalDeposit (iteration_best);
    global_best =new Ant (*iteration_best);
    
    
  }